

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O3

from_chars_result_t<char>
fast_float::from_chars_advanced<double,char>
          (char *first,char *last,double *value,parse_options_t<char> options)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  from_chars_result_t<char> fVar14;
  from_chars_result_t<char> fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  byte *pbVar19;
  long lVar20;
  byte bVar21;
  int iVar22;
  undefined4 uVar23;
  ulong uVar24;
  undefined4 uVar25;
  undefined8 uVar26;
  byte *pbVar27;
  long lVar28;
  ulong uVar29;
  byte *pbVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  byte *pbVar34;
  byte *pbVar35;
  byte bVar36;
  ulong uVar37;
  size_t sVar38;
  byte *pbVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  from_chars_result_t<char> fVar44;
  adjusted_mantissa aVar45;
  from_chars_result_t<char> fVar46;
  parsed_number_string_t<char> pns;
  parsed_number_string_t<char> local_78;
  
  if (first == last) {
    uVar26 = 0x16;
    goto LAB_0012eff6;
  }
  local_78.fraction.ptr = (char *)0x0;
  local_78.fraction.length = 0;
  local_78.exponent = 0;
  local_78.mantissa._0_3_ = 0;
  local_78.mantissa._3_5_ = 0;
  local_78.lastmatch._0_3_ = 0;
  local_78.lastmatch._3_5_ = 0;
  local_78.valid = false;
  local_78.too_many_digits = false;
  bVar21 = *first;
  local_78.negative = bVar21 == 0x2d;
  bVar31 = options.decimal_point;
  pbVar27 = (byte *)first;
  bVar36 = bVar21;
  if (!local_78.negative) goto LAB_0012e6d5;
  pbVar27 = (byte *)(first + 1);
  if (pbVar27 != (byte *)last) {
    bVar36 = *pbVar27;
    if (((ulong)options & 0x20) == 0) {
      if (bVar36 == bVar31 || (byte)(bVar36 - 0x30) < 10) {
LAB_0012e6d5:
        if (pbVar27 == (byte *)last) {
          bVar41 = true;
          uVar40 = 0;
          pbVar35 = pbVar27;
        }
        else {
          uVar40 = 0;
          pbVar34 = pbVar27;
          do {
            bVar41 = (byte)(*pbVar34 - 0x30) < 10;
            pbVar35 = pbVar34;
            if (!bVar41) break;
            uVar40 = ((ulong)*pbVar34 + uVar40 * 10) - 0x30;
            pbVar34 = pbVar34 + 1;
            pbVar35 = (byte *)last;
          } while (pbVar34 != (byte *)last);
        }
        local_78.integer.length = (long)pbVar35 - (long)pbVar27;
        local_78.integer.ptr = (char *)pbVar27;
        if ((((ulong)options & 0x20) == 0) ||
           ((local_78.integer.length != 0 && ((long)local_78.integer.length < 2 || bVar36 != 0x30)))
           ) {
          if ((bVar41) || (*pbVar35 != bVar31)) {
            bVar36 = 0;
            pbVar30 = (byte *)0x0;
            pbVar34 = pbVar35;
            sVar38 = local_78.integer.length;
          }
          else {
            local_78.fraction.ptr = (char *)(pbVar35 + 1);
            pbVar30 = (byte *)local_78.fraction.ptr;
            pbVar39 = (byte *)local_78.fraction.ptr;
            if (7 < (long)last - (long)local_78.fraction.ptr) {
              uVar29 = ~(ulong)pbVar35;
              do {
                aVar45.mantissa = *(long *)pbVar30 + 0xcfcfcfcfcfcfcfd0;
                if (((*(long *)pbVar30 + 0x4646464646464646U | aVar45.mantissa) & 0x8080808080808080
                    ) != 0) break;
                aVar45.mantissa = (aVar45.mantissa >> 8) + aVar45.mantissa * 10;
                uVar40 = ((aVar45.mantissa >> 0x10 & 0xff000000ff) * 0x271000000001 +
                          (aVar45.mantissa & 0xff000000ff) * 0xf424000000064 >> 0x20) +
                         uVar40 * 100000000;
                pbVar30 = pbVar30 + 8;
                lVar28 = uVar29 - 8;
                uVar29 = uVar29 - 8;
              } while (7 < (long)(last + lVar28));
              pbVar39 = (byte *)-uVar29;
            }
            pbVar34 = pbVar30;
            if (pbVar30 != (byte *)last) {
              pbVar19 = pbVar30 + ((long)last - (long)pbVar39);
              do {
                bVar36 = *pbVar30;
                pbVar34 = pbVar30;
                pbVar39 = pbVar30;
                if (9 < (byte)(bVar36 - 0x30)) break;
                pbVar30 = pbVar30 + 1;
                uVar40 = (ulong)(byte)(bVar36 - 0x30) + uVar40 * 10;
                pbVar34 = pbVar19;
                pbVar39 = pbVar19;
              } while (pbVar30 != (byte *)last);
            }
            pbVar30 = (byte *)local_78.fraction.ptr + -(long)pbVar39;
            local_78.fraction.length = (long)pbVar39 - (long)local_78.fraction.ptr;
            bVar36 = 1;
            sVar38 = local_78.integer.length - (long)pbVar30;
          }
          if (((ulong)options & 0x20) == 0) {
            if (sVar38 != 0) {
LAB_0012e8b4:
              if (((((ulong)options & 1) == 0) || (pbVar34 == (byte *)last)) ||
                 (bVar36 = *pbVar34, (bVar36 | 0x20) != 0x65)) {
                if ((((ulong)options & 0x40) != 0) && (pbVar34 != (byte *)last)) {
                  bVar36 = *pbVar34;
                  if ((bVar36 - 0x2b < 0x3a) &&
                     ((0x200000002000005U >> ((ulong)(bVar36 - 0x2b) & 0x3f) & 1) != 0))
                  goto LAB_0012e8f5;
                }
                if ((options.format & general) == scientific) goto LAB_0012ea5f;
LAB_0012e93c:
                lVar28 = 0;
              }
              else {
LAB_0012e8f5:
                pbVar39 = pbVar34;
                if ((bVar36 - 0x44 < 0x22) &&
                   ((0x300000003U >> ((ulong)(bVar36 - 0x44) & 0x3f) & 1) != 0)) {
                  pbVar39 = pbVar34 + 1;
                }
                if (pbVar39 == (byte *)last) {
LAB_0012e94c:
                  bVar41 = false;
                }
                else {
                  if (*pbVar39 != 0x2d) {
                    pbVar39 = pbVar39 + (*pbVar39 == 0x2b);
                    goto LAB_0012e94c;
                  }
                  pbVar39 = pbVar39 + 1;
                  bVar41 = true;
                }
                if ((pbVar39 == (byte *)last) || (9 < (byte)(*pbVar39 - 0x30))) {
                  if (((ulong)options & 4) == 0) goto LAB_0012ea5f;
                  goto LAB_0012e93c;
                }
                lVar20 = 0;
                do {
                  pbVar34 = pbVar39;
                  if (9 < (byte)(*pbVar39 - 0x30)) break;
                  if (lVar20 < 0x10000000) {
                    lVar20 = (ulong)(byte)(*pbVar39 - 0x30) + lVar20 * 10;
                  }
                  pbVar39 = pbVar39 + 1;
                  pbVar34 = (byte *)last;
                } while (pbVar39 != (byte *)last);
                lVar28 = -lVar20;
                if (!bVar41) {
                  lVar28 = lVar20;
                }
                pbVar30 = pbVar30 + lVar28;
              }
              local_78.lastmatch._0_3_ = SUB83(pbVar34,0);
              local_78.lastmatch._3_5_ = (undefined5)((ulong)pbVar34 >> 0x18);
              local_78.valid = true;
              if (0x13 < (long)sVar38) {
                pbVar39 = pbVar27;
                if (pbVar27 == (byte *)last) {
LAB_0012e9fc:
                  local_78.too_many_digits = true;
                  pbVar30 = (byte *)local_78.fraction.ptr;
                  sVar38 = local_78.fraction.length;
                  if (local_78.integer.length == 0) {
                    uVar40 = 0;
                    goto joined_r0x0012eb07;
                  }
                  uVar40 = 0;
                  pbVar39 = pbVar27;
                  do {
                    pbVar39 = pbVar39 + 1;
                    uVar40 = ((long)(char)*pbVar27 + uVar40 * 10) - 0x30;
                    pbVar27 = pbVar27 + 1;
                    if (999999999999999999 < uVar40) break;
                  } while (pbVar35 != pbVar39);
                  do {
                    if (999999999999999999 < uVar40) goto LAB_0012eb56;
joined_r0x0012eb07:
                    pbVar27 = pbVar30;
                    pbVar35 = (byte *)local_78.fraction.ptr;
                    if (sVar38 == 0) goto LAB_0012eb56;
                    uVar40 = ((long)(char)*pbVar27 + uVar40 * 10) - 0x30;
                    pbVar27 = pbVar27 + 1;
                    pbVar30 = pbVar27;
                    sVar38 = sVar38 - 1;
                  } while( true );
                }
                do {
                  bVar36 = *pbVar39;
                  if (bVar36 != bVar31 && bVar36 != 0x30) break;
                  sVar38 = sVar38 - (bVar36 == 0x30);
                  pbVar39 = pbVar39 + 1;
                } while (pbVar39 != (byte *)last);
                if (0x13 < (long)sVar38) goto LAB_0012e9fc;
              }
              local_78.mantissa._0_3_ = (undefined3)uVar40;
              local_78.mantissa._3_5_ = (undefined5)(uVar40 >> 0x18);
              if (pbVar30 + -0x17 < (byte *)0xffffffffffffffd3) {
LAB_0012eb4b:
                bVar41 = false;
                goto LAB_0012eb6c;
              }
              if ((detail::rounds_to_nearest()::fmin + 1.0 !=
                   1.0 - detail::rounds_to_nearest()::fmin) ||
                 (NAN(detail::rounds_to_nearest()::fmin + 1.0) ||
                  NAN(1.0 - detail::rounds_to_nearest()::fmin))) {
                if (((long)pbVar30 < 0) ||
                   (binary_format_lookup_tables<double,_void>::max_mantissa[(long)pbVar30] < uVar40)
                   ) goto LAB_0012eb4b;
                if (uVar40 == 0) {
                  if (bVar21 == 0x2d) {
                    uVar33 = 0x80000000;
                  }
                  else {
                    uVar33 = 0;
                  }
                  *value = (double)((ulong)uVar33 << 0x20);
                  fVar44._8_8_ = 0;
                  fVar44.ptr = (char *)pbVar34;
                }
                else {
                  fVar15._8_8_ = 0;
                  fVar15.ptr = (char *)pbVar34;
                  fVar44._8_8_ = 0;
                  fVar44.ptr = (char *)pbVar34;
                  auVar43._8_4_ = (int)(uVar40 >> 0x20);
                  auVar43._0_8_ = uVar40;
                  auVar43._12_4_ = 0x45300000;
                  dVar13 = ((auVar43._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar40) - 4503599627370496.0)) *
                           binary_format_lookup_tables<double,_void>::powers_of_ten[(long)pbVar30];
                  *value = dVar13;
                  if (bVar21 == 0x2d) {
                    *value = -dVar13;
                    fVar44 = fVar15;
                  }
                }
              }
              else {
                if (0x20000000000000 < uVar40) goto LAB_0012eb4b;
                dVar13 = (double)(long)uVar40;
                *value = dVar13;
                if ((long)pbVar30 < 0) {
                  dVar13 = dVar13 / binary_format_lookup_tables<double,_void>::powers_of_ten
                                    [-(long)pbVar30];
                }
                else {
                  dVar13 = dVar13 * binary_format_lookup_tables<double,_void>::powers_of_ten
                                    [(long)pbVar30];
                }
                fVar14._8_8_ = 0;
                fVar14.ptr = (char *)pbVar34;
                fVar44._8_8_ = 0;
                fVar44.ptr = (char *)pbVar34;
                *value = dVar13;
                if (bVar21 == 0x2d) {
                  *value = -dVar13;
                  fVar44 = fVar14;
                }
              }
              goto LAB_0012efe5;
            }
          }
          else if (!(bool)(bVar36 & pbVar30 == (byte *)0x0)) goto LAB_0012e8b4;
        }
      }
    }
    else if ((byte)(bVar36 - 0x30) < 10) goto LAB_0012e6d5;
  }
LAB_0012ea5f:
  if (((ulong)options & 0x10) == 0) {
    fVar44 = detail::parse_infnan<double,char>(first,last,value);
  }
  else {
    fVar44._8_8_ = 0x16;
    fVar44.ptr = first;
  }
  goto LAB_0012efe5;
LAB_0012eb56:
  pbVar30 = pbVar35 + (lVar28 - (long)pbVar27);
  local_78.mantissa._0_3_ = (undefined3)uVar40;
  local_78.mantissa._3_5_ = (undefined5)(uVar40 >> 0x18);
  bVar41 = true;
LAB_0012eb6c:
  uVar29 = 0;
  iVar18 = (int)pbVar30;
  if ((long)pbVar30 < -0x156) {
LAB_0012eb95:
    aVar45.mantissa = 0;
  }
  else {
    aVar45.mantissa = 0;
    if (uVar40 != 0) {
      if (0x134 < (long)pbVar30) {
        uVar29 = 0x7ff;
        goto LAB_0012eb95;
      }
      uVar29 = 0x3f;
      if (uVar40 != 0) {
        for (; uVar40 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      aVar45.mantissa = uVar40 << ((byte)(uVar29 ^ 0x3f) & 0x3f);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = aVar45.mantissa;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ac];
      auVar1 = auVar1 * auVar7;
      if ((~auVar1._8_4_ & 0x1ff) == 0) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = aVar45.mantissa;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ad];
        auVar16._8_8_ = 0;
        auVar16._0_8_ = SUB168(auVar2 * auVar8,8);
        auVar1 = auVar1 + auVar16;
      }
      iVar22 = (((iVar18 * 0x3526a >> 0x10) - (int)(uVar29 ^ 0x3f)) - (auVar1._12_4_ >> 0x1f)) +
               0x43e;
      bVar21 = 9 - (auVar1[0xf] >> 7);
      uVar29 = auVar1._8_8_ >> (bVar21 & 0x3f);
      if (iVar22 < 1) {
        uVar33 = 1 - iVar22;
        if (0x3f < uVar33) {
          uVar29 = 0;
          goto LAB_0012eb95;
        }
        aVar45.mantissa =
             (uVar29 >> ((byte)uVar33 & 0x3f)) +
             (ulong)((uVar29 >> ((ulong)uVar33 & 0x3f) & 1) != 0);
        uVar29 = (ulong)(aVar45.mantissa >> 0x35 != 0);
        aVar45.mantissa = aVar45.mantissa >> 1;
      }
      else {
        aVar45.mantissa = uVar29 & 0xfffffffffffffe;
        if (uVar29 << (bVar21 & 0x3f) != auVar1._8_8_ || ((uint)uVar29 & 3) != 1) {
          aVar45.mantissa = uVar29;
        }
        if (1 < auVar1._0_8_) {
          aVar45.mantissa = uVar29;
        }
        if ((byte *)0x1b < pbVar30 + 4) {
          aVar45.mantissa = uVar29;
        }
        uVar29 = (ulong)((uint)aVar45.mantissa & 1);
        bVar42 = uVar29 + aVar45.mantissa >> 0x36 != 0;
        aVar45.mantissa = (aVar45.mantissa >> 1) + (uVar29 & aVar45.mantissa) & 0x7fefffffffffffff;
        if (bVar42) {
          aVar45.mantissa = 0;
        }
        uVar32 = iVar22 + (uint)bVar42;
        uVar33 = uVar32;
        if (0x7fe < uVar32) {
          uVar33 = 0x7ff;
        }
        uVar29 = (ulong)uVar33;
        if (0x7fe < uVar32) {
          aVar45.mantissa = 0;
        }
      }
    }
  }
  if (bVar41) {
    uVar37 = uVar40 + 1;
    uVar33 = 0;
    if ((long)pbVar30 < -0x156) {
LAB_0012ed15:
      uVar24 = 0;
    }
    else {
      uVar24 = 0;
      uVar33 = 0;
      if (uVar37 != 0) {
        if (0x134 < (long)pbVar30) {
          uVar33 = 0x7ff;
          goto LAB_0012ed15;
        }
        uVar24 = 0x3f;
        if (uVar37 != 0) {
          for (; uVar37 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        uVar37 = uVar37 << ((byte)(uVar24 ^ 0x3f) & 0x3f);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar37;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ac];
        auVar3 = auVar3 * auVar9;
        if ((~auVar3._8_4_ & 0x1ff) == 0) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar37;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ad];
          auVar17._8_8_ = 0;
          auVar17._0_8_ = SUB168(auVar4 * auVar10,8);
          auVar3 = auVar3 + auVar17;
        }
        iVar22 = (((iVar18 * 0x3526a >> 0x10) - (int)(uVar24 ^ 0x3f)) - (auVar3._12_4_ >> 0x1f)) +
                 0x43e;
        bVar21 = 9 - (auVar3[0xf] >> 7);
        uVar37 = auVar3._8_8_ >> (bVar21 & 0x3f);
        if (iVar22 < 1) {
          uVar33 = 1 - iVar22;
          if (0x3f < uVar33) {
            uVar33 = 0;
            goto LAB_0012ed15;
          }
          uVar37 = (uVar37 >> ((byte)uVar33 & 0x3f)) +
                   (ulong)((uVar37 >> ((ulong)uVar33 & 0x3f) & 1) != 0);
          uVar24 = uVar37 >> 1;
          uVar33 = (uint)(uVar37 >> 0x35 != 0);
        }
        else {
          uVar24 = uVar37 & 0xfffffffffffffe;
          if (uVar37 << (bVar21 & 0x3f) != auVar3._8_8_ || ((uint)uVar37 & 3) != 1) {
            uVar24 = uVar37;
          }
          if (1 < auVar3._0_8_) {
            uVar24 = uVar37;
          }
          if ((byte *)0x1b < pbVar30 + 4) {
            uVar24 = uVar37;
          }
          uVar37 = (ulong)((uint)uVar24 & 1);
          bVar41 = uVar37 + uVar24 >> 0x36 != 0;
          uVar24 = (uVar24 >> 1) + (uVar37 & uVar24) & 0x7fefffffffffffff;
          if (bVar41) {
            uVar24 = 0;
          }
          uVar33 = iVar22 + (uint)bVar41;
          if (0x7fe < uVar33) {
            uVar24 = 0;
            uVar33 = 0x7ff;
          }
        }
      }
    }
    if ((aVar45.mantissa != uVar24) || ((uint)uVar29 != uVar33)) {
      uVar29 = 0x3f;
      if (uVar40 != 0) {
        for (; uVar40 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      aVar45.mantissa = uVar40 << ((byte)(uVar29 ^ 0x3f) & 0x3f);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = aVar45.mantissa;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ac];
      auVar5 = auVar5 * auVar11;
      lVar28 = auVar5._8_8_;
      if ((~auVar5._8_4_ & 0x1ff) == 0) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = aVar45.mantissa;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = powers_template<void>::power_of_five_128[iVar18 * 2 + 0x2ad];
        lVar28 = lVar28 + (ulong)CARRY8(SUB168(auVar6 * auVar12,8),auVar5._0_8_);
      }
      aVar45.mantissa = lVar28 << ((byte)((ulong)lVar28 >> 0x3f) ^ 1);
      iVar22 = iVar18 * 0x3526a >> 0x10;
      iVar18 = -(int)(uVar29 ^ 0x3f) - (int)(lVar28 >> 0x3f);
      uVar33 = (iVar18 + iVar22) - 0x7bcd;
      uVar29 = (ulong)uVar33;
      if (iVar18 + iVar22 < 0x7bcd) {
        aVar45.power2 = uVar33;
        aVar45._12_4_ = 0;
        local_78.exponent = (int64_t)pbVar30;
        aVar45 = digit_comp<double,char>(&local_78,aVar45);
        uVar29 = (ulong)(uint)aVar45.power2;
        uVar40 = CONCAT53(local_78.mantissa._3_5_,(undefined3)local_78.mantissa);
      }
    }
  }
  uVar23 = 0;
  if ((int)uVar29 == 0x7ff) {
    uVar23 = 0x22;
  }
  uVar25 = 0x22;
  if ((int)uVar29 != 0) {
    uVar25 = uVar23;
  }
  if (aVar45.mantissa != 0) {
    uVar25 = uVar23;
  }
  fVar44.ec = uVar25;
  fVar44.ptr = (char *)pbVar34;
  fVar44._12_4_ = 0;
  *value = (double)((ulong)local_78.negative << 0x3f | uVar29 << 0x34 | aVar45.mantissa);
  if (uVar40 == 0) {
    fVar44.ec = uVar23;
    fVar44._12_4_ = 0;
  }
LAB_0012efe5:
  uVar26 = fVar44._8_8_;
  first = fVar44.ptr;
LAB_0012eff6:
  fVar46._8_8_ = uVar26;
  fVar46.ptr = first;
  return fVar46;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (is_supported_float_type<T>(), "only some floating-point types are supported");
  static_assert (is_supported_char_type<UC>(), "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    if (options.format & chars_format::no_infnan) {
      answer.ec = std::errc::invalid_argument;
      answer.ptr = first;
      return answer;
    } else {
      return detail::parse_infnan(first, last, value);
    }
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__) || defined(FASTFLOAT_32BIT)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? T(-0.) : T(0.);
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}